

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::errors<char[25],char[27],char[11],char[27]>
            (char (*args) [25],char (*args_1) [27],char (*args_2) [11],char (*args_3) [27])

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *this;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  allocator_type *in_stack_fffffffffffffd88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  string *psVar1;
  iterator in_stack_fffffffffffffd98;
  undefined1 *puVar2;
  undefined1 local_1eb;
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [55];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string *local_c0;
  string local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  string *local_38;
  undefined8 local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  local_1ea = 1;
  local_c0 = local_b8;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,in_RSI,&local_101);
  std::operator+((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  local_c0 = (string *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,local_18,&local_159);
  std::operator+((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  local_c0 = (string *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,local_20,&local_1a1);
  std::operator+((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  local_c0 = (string *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,local_28,&local_1e9);
  std::operator+((char *)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  local_1ea = 0;
  local_38 = local_b8;
  local_30 = 4;
  puVar2 = &local_1eb;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10f2e4);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_stack_fffffffffffffd98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffd90,__l,in_stack_fffffffffffffd88);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10f315);
  psVar1 = local_b8;
  this = (string *)&local_38;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar1);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  return in_RDI;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}